

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmac.cpp
# Opt level: O0

void VHASH_32(void *key,int len,uint32_t seed,void *res)

{
  uint64_t uVar1;
  undefined4 *in_RCX;
  uint in_EDX;
  uint64_t tagl;
  vmac_ctx_t *in_stack_000000f8;
  uint64_t *in_stack_00000100;
  uint in_stack_0000010c;
  uchar *in_stack_00000110;
  
  vhi.ctx.polytmp[0] = (uint64_t)in_EDX;
  uVar1 = vhash(in_stack_00000110,in_stack_0000010c,in_stack_00000100,in_stack_000000f8);
  *in_RCX = (int)uVar1;
  return;
}

Assistant:

void VHASH_32( const void * key, int len, uint32_t seed, void * res )
{
    uint64_t tagl;
#if _WORDSIZE > 32
    *(size_t*)res = 0;
#endif
#if (VMAC_TAG_LEN == 128)
    ctx.polytmp[0] = seed;
    vhash( (unsigned char *)key, len, &tagl, &ctx);
    *(uint32_t*)res = (uint32_t)tagl;
#elif (VMAC_TAG_LEN == 64)
    vhi.ctx.polytmp[0] = seed;
    *(uint32_t*)res = (uint32_t)vhash( (unsigned char *)key, len, &tagl, &(vhi.ctx) );

#else
#error VMAC_TAG_LEN could be either 64 or 128
#endif
}